

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_action_inout(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  uint uVar1;
  lysp_node *plVar2;
  lys_module *plVar3;
  LY_ERR LVar4;
  long *plVar5;
  lysp_ext_instance *plVar6;
  lysp_ext_instance *plVar7;
  uint uVar8;
  long lVar9;
  lysp_restr *must_p;
  long lVar10;
  long lVar11;
  lysp_node **pplVar12;
  
  uVar1 = ctx->compile_opts;
  plVar2 = pnode[1].parent;
  uVar8 = uVar1;
  if (plVar2 != (lysp_node *)0x0) {
    plVar3 = node[1].module;
    if (plVar3 == (lys_module *)0x0) {
      plVar5 = (long *)calloc(1,(long)plVar2[-1].exts * 0x38 + 8);
      if (plVar5 == (long *)0x0) goto LAB_001466ce;
      lVar9 = 0;
      lVar10 = 0;
    }
    else {
      lVar10 = *(long *)&plVar3[-1].implemented;
      plVar5 = (long *)realloc(&plVar3[-1].implemented,
                               ((long)&(plVar2[-1].exts)->name + lVar10 * 2) * 0x38 + 8);
      if (plVar5 == (long *)0x0) {
LAB_001466ce:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_node_action_inout");
        return LY_EMEM;
      }
      lVar9 = *plVar5;
    }
    node[1].module = (lys_module *)(plVar5 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar6 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar6 = pnode[1].parent[-1].exts;
    }
    lVar11 = 0;
    memset(plVar5 + lVar9 * 7 + 1,0,((long)&plVar6->name + lVar10) * 0x38);
    plVar6 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar2 = pnode[1].parent;
      if (plVar2 == (lysp_node *)0x0) {
        plVar7 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar7 = plVar2[-1].exts;
      }
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      if (plVar7 <= plVar6) break;
      plVar3 = node[1].module;
      lVar10 = *(long *)&plVar3[-1].implemented;
      *(long *)&plVar3[-1].implemented = lVar10 + 1;
      must_p = (lysp_restr *)((long)&plVar2->parent + lVar11);
      lVar11 = lVar11 + 0x40;
      LVar4 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar3->ctx + lVar10 * 7));
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
    }
    uVar8 = ctx->compile_opts;
  }
  ctx->compile_opts = (uint)(pnode->nodetype != 0x1000) * 0x1000 + 0x1004 | uVar8;
  pplVar12 = (lysp_node **)&pnode[1].name;
  do {
    plVar2 = *pplVar12;
    if (plVar2 == (lysp_node *)0x0) {
      LVar4 = lys_compile_node_augments(ctx,node);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      ctx->compile_opts = uVar1;
      return LY_SUCCESS;
    }
    LVar4 = lys_compile_node(ctx,plVar2,node,0,(ly_set *)0x0);
    pplVar12 = &plVar2->next;
  } while (LVar4 == LY_SUCCESS);
  return LVar4;
}

Assistant:

LY_ERR
lys_compile_node_action_inout(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    uint32_t prev_options = ctx->compile_opts;

    struct lysp_node_action_inout *inout_p = (struct lysp_node_action_inout *)pnode;
    struct lysc_node_action_inout *inout = (struct lysc_node_action_inout *)node;

    COMPILE_ARRAY_GOTO(ctx, inout_p->musts, inout->musts, lys_compile_must, ret, done);
    ctx->compile_opts |= (inout_p->nodetype == LYS_INPUT) ? LYS_COMPILE_RPC_INPUT : LYS_COMPILE_RPC_OUTPUT;

    LY_LIST_FOR(inout_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    ctx->compile_opts = prev_options;

done:
    return ret;
}